

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall QEvdevTabletData::processInputEvent(QEvdevTabletData *this,input_event *ev)

{
  short sVar1;
  undefined4 uVar2;
  long in_RSI;
  long in_RDI;
  QEvdevTabletData *in_stack_00000060;
  
  if (*(short *)(in_RSI + 0x10) == 3) {
    switch(*(undefined2 *)(in_RSI + 0x12)) {
    case 0:
      *(undefined4 *)(in_RDI + 0x48) = *(undefined4 *)(in_RSI + 0x14);
      break;
    case 1:
      *(undefined4 *)(in_RDI + 0x4c) = *(undefined4 *)(in_RSI + 0x14);
      break;
    default:
      break;
    case 0x18:
      *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RSI + 0x14);
      break;
    case 0x19:
      *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_RSI + 0x14);
    }
  }
  else if (*(short *)(in_RSI + 0x10) == 1) {
    sVar1 = *(short *)(in_RSI + 0x12);
    if (sVar1 == 0x140) {
      uVar2 = 0;
      if (*(int *)(in_RSI + 0x14) != 0) {
        uVar2 = 4;
      }
      *(undefined4 *)(in_RDI + 0x5c) = uVar2;
    }
    else if (sVar1 == 0x141) {
      uVar2 = 0;
      if (*(int *)(in_RSI + 0x14) != 0) {
        uVar2 = 8;
      }
      *(undefined4 *)(in_RDI + 0x5c) = uVar2;
    }
    else if (sVar1 == 0x14a) {
      *(bool *)(in_RDI + 0x58) = *(int *)(in_RSI + 0x14) != 0;
    }
  }
  else if (((*(short *)(in_RSI + 0x10) == 0) && (*(short *)(in_RSI + 0x12) == 0)) &&
          (*(uint *)(in_RDI + 8) != (uint)*(ushort *)(in_RSI + 0x10))) {
    report(in_stack_00000060);
  }
  *(uint *)(in_RDI + 8) = (uint)*(ushort *)(in_RSI + 0x10);
  return;
}

Assistant:

void QEvdevTabletData::processInputEvent(input_event *ev)
{
    if (ev->type == EV_ABS) {
        switch (ev->code) {
        case ABS_X:
            state.x = ev->value;
            break;
        case ABS_Y:
            state.y = ev->value;
            break;
        case ABS_PRESSURE:
            state.p = ev->value;
            break;
        case ABS_DISTANCE:
            state.d = ev->value;
            break;
        default:
            break;
        }
    } else if (ev->type == EV_KEY) {
        // code BTN_TOOL_* value 1 -> proximity enter
        // code BTN_TOOL_* value 0 -> proximity leave
        // code BTN_TOUCH value 1 -> contact with screen
        // code BTN_TOUCH value 0 -> no contact
        switch (ev->code) {
        case BTN_TOUCH:
            state.down = ev->value != 0;
            break;
        case BTN_TOOL_PEN:
            state.tool = ev->value ? int(QPointingDevice::PointerType::Pen) : 0;
            break;
        case BTN_TOOL_RUBBER:
            state.tool = ev->value ? int(QPointingDevice::PointerType::Eraser) : 0;
            break;
        default:
            break;
        }
    } else if (ev->type == EV_SYN && ev->code == SYN_REPORT && lastEventType != ev->type) {
        report();
    }
    lastEventType = ev->type;
}